

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

int htmlIsBooleanAttr(xmlChar *name)

{
  int iVar1;
  int local_1c;
  int i;
  xmlChar *name_local;
  
  local_1c = 0;
  while( true ) {
    if (htmlBooleanAttrs[local_1c] == (char *)0x0) {
      return 0;
    }
    iVar1 = xmlStrcasecmp((xmlChar *)htmlBooleanAttrs[local_1c],name);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return 1;
}

Assistant:

int
htmlIsBooleanAttr(const xmlChar *name)
{
    int i = 0;

    while (htmlBooleanAttrs[i] != NULL) {
        if (xmlStrcasecmp((const xmlChar *)htmlBooleanAttrs[i], name) == 0)
            return 1;
        i++;
    }
    return 0;
}